

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  bool bVar1;
  TestEventListeners *this_00;
  XmlUnitTestResultPrinter *this_01;
  char *pcVar2;
  String local_48 [2];
  String local_28;
  String *local_18;
  String *output_format;
  UnitTestImpl *this_local;
  
  output_format = (String *)this;
  UnitTestOptions::GetOutputFormat();
  local_18 = &local_28;
  bVar1 = String::operator==(&local_28,"xml");
  if (bVar1) {
    this_00 = listeners(this);
    this_01 = (XmlUnitTestResultPrinter *)operator_new(0x18);
    UnitTestOptions::GetAbsolutePathToOutputFile();
    pcVar2 = String::c_str(local_48);
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_01,pcVar2);
    TestEventListeners::SetDefaultXmlGenerator(this_00,(TestEventListener *)this_01);
    String::~String(local_48);
  }
  else {
    bVar1 = String::operator!=(local_18,"");
    if (bVar1) {
      pcVar2 = String::c_str(local_18);
      printf("WARNING: unrecognized output format \"%s\" ignored.\n",pcVar2);
      fflush(_stdout);
    }
  }
  String::~String(&local_28);
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const String& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format != "") {
    printf("WARNING: unrecognized output format \"%s\" ignored.\n",
           output_format.c_str());
    fflush(stdout);
  }
}